

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

QList<QRect> *
QMdi::MinOverlapPlacer::getCandidatePlacements
          (QList<QRect> *__return_storage_ptr__,QSize *size,QList<QRect> *rects,QRect *domain)

{
  int *piVar1;
  QRect *pQVar2;
  int *piVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  int *local_b0;
  QRect local_88;
  QList<int> local_78;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QRect *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (int *)0x0;
  local_58.d.size = 0;
  QList<int>::reserve(&local_58,(rects->d).size + 2);
  local_78.d.d._0_4_ = (domain->x1).m_i;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_78);
  QList<int>::end(&local_58);
  local_78.d.d = (Data *)CONCAT44(local_78.d.d._4_4_,((domain->x2).m_i - (size->wd).m_i) + 1);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_78);
  QList<int>::end(&local_58);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (int *)0x0;
  local_78.d.size = 0;
  QList<int>::reserve(&local_78,(rects->d).size + 2);
  local_88.x1.m_i = (domain->y1).m_i;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_88);
  QList<int>::end(&local_78);
  iVar4 = (domain->y2).m_i - (size->ht).m_i;
  if (-2 < iVar4) {
    local_88.x1.m_i = iVar4 + 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_88);
    QList<int>::end(&local_78);
  }
  lVar8 = (rects->d).size;
  if (lVar8 != 0) {
    pQVar2 = (rects->d).ptr;
    lVar9 = 0;
    do {
      local_88.x1.m_i = *(int *)((long)&(pQVar2->x2).m_i + lVar9) + 1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_88);
      QList<int>::end(&local_58);
      local_88.x1.m_i = *(int *)((long)&(pQVar2->y2).m_i + lVar9) + 1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_88);
      QList<int>::end(&local_78);
      lVar9 = lVar9 + 0x10;
    } while (lVar8 << 4 != lVar9);
  }
  iVar5 = QList<int>::begin(&local_58);
  iVar6 = QList<int>::end(&local_58);
  if (iVar5.i != iVar6.i) {
    uVar7 = (long)iVar6.i - (long)iVar5.i >> 2;
    lVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i);
  }
  iVar5 = QList<int>::begin(&local_58);
  iVar6 = QList<int>::end(&local_58);
  iVar5 = std::__unique<QList<int>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>(iVar5.i,iVar6.i)
  ;
  iVar6 = QList<int>::end(&local_58);
  QList<int>::erase(&local_58,(const_iterator)iVar5.i,(const_iterator)iVar6.i);
  iVar5 = QList<int>::begin(&local_78);
  iVar6 = QList<int>::end(&local_78);
  if (iVar5.i != iVar6.i) {
    uVar7 = (long)iVar6.i - (long)iVar5.i >> 2;
    lVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i);
  }
  iVar5 = QList<int>::begin(&local_78);
  iVar6 = QList<int>::end(&local_78);
  iVar5 = std::__unique<QList<int>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>(iVar5.i,iVar6.i)
  ;
  iVar6 = QList<int>::end(&local_78);
  QList<int>::erase(&local_78,(const_iterator)iVar5.i,(const_iterator)iVar6.i);
  QList<QRect>::reserve(__return_storage_ptr__,local_58.d.size * local_78.d.size);
  if (local_78.d.size != 0) {
    local_b0 = local_78.d.ptr;
    piVar1 = local_78.d.ptr + local_78.d.size;
    do {
      piVar3 = local_58.d.ptr;
      if (local_58.d.size != 0) {
        iVar4 = *local_b0;
        lVar8 = local_58.d.size << 2;
        lVar9 = 0;
        do {
          local_88.x1.m_i = *(int *)((long)piVar3 + lVar9);
          local_88.x2.m_i = local_88.x1.m_i + (size->wd).m_i + -1;
          local_88.y2.m_i = (size->ht).m_i + iVar4 + -1;
          local_88.y1.m_i = iVar4;
          QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                    ((QMovableArrayOps<QRect> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_88);
          QList<QRect>::end(__return_storage_ptr__);
          lVar9 = lVar9 + 4;
        } while (lVar8 != lVar9);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != piVar1);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QRect> MinOverlapPlacer::getCandidatePlacements(const QSize &size, const QList<QRect> &rects,
                                                      const QRect &domain)
{
    QList<QRect> result;

    QList<int> xlist;
    xlist.reserve(2 + rects.size());
    xlist << domain.left() << domain.right() - size.width() + 1;

    QList<int> ylist;
    ylist.reserve(2 + rects.size());
    ylist << domain.top();
    if (domain.bottom() - size.height() + 1 >= 0)
        ylist << domain.bottom() - size.height() + 1;

    for (const QRect &rect : rects) {
        xlist << rect.right() + 1;
        ylist << rect.bottom() + 1;
    }

    std::sort(xlist.begin(), xlist.end());
    xlist.erase(std::unique(xlist.begin(), xlist.end()), xlist.end());

    std::sort(ylist.begin(), ylist.end());
    ylist.erase(std::unique(ylist.begin(), ylist.end()), ylist.end());

    result.reserve(ylist.size() * xlist.size());
    for (int y : std::as_const(ylist))
        for (int x : std::as_const(xlist))
            result << QRect(QPoint(x, y), size);
    return result;
}